

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O0

void PVG_FT_Vector_Rotate(PVG_FT_Vector *vec,PVG_FT_Angle angle)

{
  byte bVar1;
  int iVar2;
  PVG_FT_Fixed PVar3;
  undefined1 auStack_30 [4];
  PVG_FT_Int32 half;
  PVG_FT_Vector v;
  PVG_FT_Int shift;
  PVG_FT_Angle angle_local;
  PVG_FT_Vector *vec_local;
  
  _auStack_30 = vec->x;
  v.x = vec->y;
  if ((_auStack_30 != 0) || (v.x != 0)) {
    v.y._4_4_ = ft_trig_prenorm((PVG_FT_Vector *)auStack_30);
    ft_trig_pseudo_rotate((PVG_FT_Vector *)auStack_30,angle);
    _auStack_30 = ft_trig_downscale(_auStack_30);
    PVar3 = ft_trig_downscale(v.x);
    bVar1 = (byte)v.y._4_4_;
    if (v.y._4_4_ < 1) {
      vec->x = _auStack_30 << (-bVar1 & 0x3f);
      vec->y = PVar3 << (-bVar1 & 0x3f);
    }
    else {
      iVar2 = 1 << (bVar1 - 1 & 0x1f);
      vec->x = (_auStack_30 + iVar2) - (long)(int)(uint)(_auStack_30 < 0) >> (bVar1 & 0x3f);
      vec->y = (PVar3 + iVar2) - (long)(int)(uint)(PVar3 < 0) >> (bVar1 & 0x3f);
    }
  }
  return;
}

Assistant:

void PVG_FT_Vector_Rotate(PVG_FT_Vector* vec, PVG_FT_Angle angle)
{
    PVG_FT_Int     shift;
    PVG_FT_Vector  v = *vec;

    if ( v.x == 0 && v.y == 0 )
        return;

    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_rotate( &v, angle );
    v.x = ft_trig_downscale( v.x );
    v.y = ft_trig_downscale( v.y );

    if ( shift > 0 )
    {
        PVG_FT_Int32  half = (PVG_FT_Int32)1L << ( shift - 1 );


        vec->x = ( v.x + half - ( v.x < 0 ) ) >> shift;
        vec->y = ( v.y + half - ( v.y < 0 ) ) >> shift;
    }
    else
    {
        shift  = -shift;
        vec->x = (PVG_FT_Pos)( (PVG_FT_ULong)v.x << shift );
        vec->y = (PVG_FT_Pos)( (PVG_FT_ULong)v.y << shift );
    }
}